

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::save(File *this,string *fileName)

{
  uint uVar1;
  pointer ppTVar2;
  Tag *pTVar3;
  ostream *poVar4;
  uint uVar5;
  string asStack_3c8 [32];
  stringstream stream;
  ofstream file;
  uint auStack_200 [120];
  
  std::ofstream::ofstream(&file,(fileName->_M_dataplus)._M_p,_S_out);
  uVar1 = *(uint *)((long)auStack_200 + *(long *)(_file + -0x18));
  if ((uVar1 & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Can\'t create file \"");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    poVar4 = std::operator<<(poVar4,"\"!");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  uVar5 = 0;
  while( true ) {
    ppTVar2 = (this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_tags).super__Vector_base<Tag_*,_std::allocator<Tag_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3) <= (ulong)uVar5)
    break;
    pTVar3 = ppTVar2[uVar5];
    (**(pTVar3->super_StreamObject)._vptr_StreamObject)(pTVar3,&stream);
    uVar5 = uVar5 + 1;
  }
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&file,asStack_3c8);
  std::__cxx11::string::~string(asStack_3c8);
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::ofstream::~ofstream(&file);
  return (uVar1 & 5) == 0;
}

Assistant:

bool File::save( std::string fileName )
{
	bool success = true;

	std::ofstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: Can't create file \"" << fileName << "\"!" << std::endl;
		success = false;
	}

	std::stringstream stream;

	for ( unsigned int i = 0; i < elements().size(); i++ )
	{
		elements()[i]->write( stream );
	}

	file << stream.str();

	file.close();

	return success;
}